

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O1

string * __thiscall
cmUuid::BinaryToString_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar *input)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = 0;
  lVar2 = 0;
  do {
    if (lVar2 != 0) {
      this = (cmUuid *)0x2d;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    for (lVar3 = (long)kUuidGroups._M_elems[lVar2]; lVar3 != 0; lVar3 = lVar3 + -1) {
      ByteToHex_abi_cxx11_((string *)local_50,this,input[lVar1]);
      this = (cmUuid *)local_50._0_8_;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_50._0_8_);
      if ((cmUuid *)local_50._0_8_ != (cmUuid *)(local_50 + 0x10)) {
        this = (cmUuid *)(local_40._M_allocated_capacity + 1);
        operator_delete((void *)local_50._0_8_,(ulong)this);
      }
      lVar1 = lVar1 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::BinaryToString(const unsigned char* input) const
{
  std::string output;

  size_t inputIndex = 0;
  for (size_t i = 0; i < kUuidGroups.size(); ++i) {
    if (i != 0) {
      output += '-';
    }

    size_t bytes = kUuidGroups[i];
    for (size_t j = 0; j < bytes; ++j) {
      unsigned char byte = input[inputIndex++];
      output += this->ByteToHex(byte);
    }
  }

  return output;
}